

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::drawPushButton
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *param_4)

{
  Int IVar1;
  QRect *in_RCX;
  QPixmapStyle *in_RDX;
  long in_FS_OFFSET;
  byte bVar2;
  byte bVar3;
  ControlDescriptor control;
  bool enabled;
  bool pressed;
  ControlDescriptor in_stack_0000001c;
  bool checked;
  StateFlag in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar4;
  undefined1 in_stack_ffffffffffffffc4;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_14;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_10;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  bVar2 = IVar1 != 0;
  local_10.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  bVar3 = IVar1 != 0;
  local_14.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  if (IVar1 != 0) {
    if ((bVar3 & 1) == 0) {
      uVar4 = 4;
      if ((bVar2 & 1) != 0) {
        uVar4 = 7;
      }
    }
    else {
      uVar4 = 5;
    }
  }
  else {
    uVar4 = 8;
    if ((bVar2 & 1) != 0) {
      uVar4 = 6;
    }
  }
  drawCachedPixmap(in_RDX,in_stack_0000001c,in_RCX,
                   (QPainter *)
                   CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(IVar1 != 0,
                                                          CONCAT14(in_stack_ffffffffffffffc4,uVar4))
                                          )));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapStyle::drawPushButton(const QStyleOption *option,
                                  QPainter *painter, const QWidget *) const
{
    const bool checked = option->state & State_On;
    const bool pressed = option->state & State_Sunken;
    const bool enabled = option->state & State_Enabled;

    ControlDescriptor control = PB_Enabled;
    if (enabled)
        control = pressed ? PB_Pressed : (checked ? PB_Checked : PB_Enabled);
    else
        control = checked ? PB_PressedDisabled : PB_Disabled;
    drawCachedPixmap(control, option->rect, painter);
}